

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

sockaddr_in Utils::get_sockaddr(char *name,int port)

{
  int __ecode;
  invalid_argument *this;
  long *plVar1;
  long *plVar2;
  uchar auVar3 [8];
  ulong uVar4;
  sockaddr_in sVar5;
  addrinfo *addr;
  addrinfo hints;
  addrinfo *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  addrinfo local_58;
  
  local_a0 = (addrinfo *)0x0;
  if (name == (char *)0x0) {
    auVar3[0] = '\0';
    auVar3[1] = '\0';
    auVar3[2] = '\0';
    auVar3[3] = '\0';
    auVar3[4] = '\0';
    auVar3[5] = '\0';
    auVar3[6] = '\0';
    auVar3[7] = '\0';
    uVar4 = 0;
  }
  else {
    local_58.ai_flags = 0;
    local_58.ai_canonname = (char *)0x0;
    local_58.ai_next = (addrinfo *)0x0;
    local_58.ai_addrlen = 0;
    local_58._20_4_ = 0;
    local_58.ai_addr = (sockaddr *)0x0;
    local_58.ai_family = 2;
    local_58.ai_socktype = 1;
    local_58.ai_protocol = 6;
    __ecode = getaddrinfo(name,(char *)0x0,&local_58,&local_a0);
    if (__ecode != 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"getaddrinfo: ","");
      gai_strerror(__ecode);
      plVar1 = (long *)std::__cxx11::string::append((char *)local_78);
      local_98 = (long *)*plVar1;
      plVar2 = plVar1 + 2;
      if (local_98 == plVar2) {
        local_88 = *plVar2;
        lStack_80 = plVar1[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar2;
      }
      local_90 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::invalid_argument::invalid_argument(this,(string *)&local_98);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    uVar4 = (ulong)*(uint *)(local_a0->ai_addr->sa_data + 2) << 0x20;
    auVar3 = *(uchar (*) [8])(local_a0->ai_addr->sa_data + 6);
    freeaddrinfo(local_a0);
  }
  uVar4 = (ulong)(ushort)((ushort)port << 8 | (ushort)port >> 8) << 0x10 | uVar4 | 2;
  sVar5.sin_zero[0] = auVar3[0];
  sVar5.sin_zero[1] = auVar3[1];
  sVar5.sin_zero[2] = auVar3[2];
  sVar5.sin_zero[3] = auVar3[3];
  sVar5.sin_zero[4] = auVar3[4];
  sVar5.sin_zero[5] = auVar3[5];
  sVar5.sin_zero[6] = auVar3[6];
  sVar5.sin_zero[7] = auVar3[7];
  sVar5.sin_family = (short)uVar4;
  sVar5.sin_port = (short)(uVar4 >> 0x10);
  sVar5.sin_addr.s_addr = (int)(uVar4 >> 0x20);
  return sVar5;
}

Assistant:

struct sockaddr_in Utils::get_sockaddr(char* name, int port) {
    struct sockaddr_in sock_addr;
    struct addrinfo *addr = NULL;
    memset(&sock_addr, 0, sizeof(sock_addr));

    if (name != NULL) {
        struct addrinfo hints;
        prepare_hints(&hints);
        int code = getaddrinfo(name, NULL, &hints, &addr);
        if (code != 0) {
            throw std::invalid_argument(std::string("getaddrinfo: ") + gai_strerror(code));
        }
        memcpy(&sock_addr, addr->ai_addr, sizeof(struct sockaddr));
        freeaddrinfo(addr);
    } else {
        sock_addr.sin_addr.s_addr = htonl(INADDR_ANY);
    }
    sock_addr.sin_family = AF_INET;
    sock_addr.sin_port = htons(port);

    return sock_addr;
}